

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

int xmlParseSGMLCatalog(xmlCatalogPtr catal,xmlChar *value,char *file,int super)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlCatalogEntryPtr pxVar3;
  bool bVar4;
  xmlChar *filename_1;
  xmlCatalogEntryPtr entry_1;
  xmlCatalogEntryPtr entry;
  xmlChar *filename;
  xmlChar *normid;
  xmlChar *pxStack_58;
  xmlCatalogEntryType type;
  xmlChar *name;
  xmlChar *sysid;
  xmlChar *pxStack_40;
  int res;
  xmlChar *base;
  xmlChar *cur;
  char *pcStack_28;
  int super_local;
  char *file_local;
  xmlChar *value_local;
  xmlCatalogPtr catal_local;
  
  pxStack_40 = (xmlChar *)0x0;
  if ((value == (xmlChar *)0x0) || (file == (char *)0x0)) {
    catal_local._4_4_ = -1;
  }
  else {
    base = value;
    cur._4_4_ = super;
    pcStack_28 = file;
    file_local = (char *)value;
    value_local = (xmlChar *)catal;
    pxStack_40 = xmlStrdup((xmlChar *)file);
LAB_0018ba11:
    do {
      bVar4 = false;
      if (base != (xmlChar *)0x0) {
        bVar4 = *base != '\0';
      }
      if (!bVar4) break;
      while( true ) {
        bVar4 = true;
        if ((*base != ' ') && ((*base < 9 || (bVar4 = true, 10 < *base)))) {
          bVar4 = *base == '\r';
        }
        if (!bVar4) break;
        base = base + 1;
      }
      if (*base == '\0') break;
      if ((*base != '-') || (base[1] != '-')) {
        name = (xmlChar *)0x0;
        pxStack_58 = (xmlChar *)0x0;
        normid._4_4_ = XML_CATA_NONE;
        base = xmlParseSGMLCatalogName(base,&stack0xffffffffffffffa8);
        if ((base == (byte *)0x0) || (pxStack_58 == (xmlChar *)0x0)) break;
        if ((*base != 0x20) && (((*base < 9 || (10 < *base)) && (*base != 0xd)))) {
          (*xmlFree)(pxStack_58);
          break;
        }
        while( true ) {
          bVar4 = true;
          if ((*base != ' ') && ((*base < 9 || (bVar4 = true, 10 < *base)))) {
            bVar4 = *base == '\r';
          }
          if (!bVar4) break;
          base = base + 1;
        }
        iVar1 = xmlStrEqual(pxStack_58,"SYSTEM");
        if (iVar1 == 0) {
          iVar1 = xmlStrEqual(pxStack_58,(xmlChar *)"PUBLIC");
          if (iVar1 == 0) {
            iVar1 = xmlStrEqual(pxStack_58,(xmlChar *)"DELEGATE");
            if (iVar1 == 0) {
              iVar1 = xmlStrEqual(pxStack_58,"ENTITY");
              if (iVar1 == 0) {
                iVar1 = xmlStrEqual(pxStack_58,(xmlChar *)"DOCTYPE");
                if (iVar1 == 0) {
                  iVar1 = xmlStrEqual(pxStack_58,(xmlChar *)"LINKTYPE");
                  if (iVar1 == 0) {
                    iVar1 = xmlStrEqual(pxStack_58,(xmlChar *)"NOTATION");
                    if (iVar1 == 0) {
                      iVar1 = xmlStrEqual(pxStack_58,(xmlChar *)"SGMLDECL");
                      if (iVar1 == 0) {
                        iVar1 = xmlStrEqual(pxStack_58,(xmlChar *)"DOCUMENT");
                        if (iVar1 == 0) {
                          iVar1 = xmlStrEqual(pxStack_58,"CATALOG");
                          if (iVar1 == 0) {
                            iVar1 = xmlStrEqual(pxStack_58,(xmlChar *)"BASE");
                            if (iVar1 == 0) {
                              iVar1 = xmlStrEqual(pxStack_58,(xmlChar *)"OVERRIDE");
                              if (iVar1 != 0) {
                                (*xmlFree)(pxStack_58);
                                base = xmlParseSGMLCatalogName(base,&stack0xffffffffffffffa8);
                                if (pxStack_58 == (xmlChar *)0x0) break;
                                (*xmlFree)(pxStack_58);
                                goto LAB_0018ba11;
                              }
                            }
                            else {
                              normid._4_4_ = SGML_CATA_BASE;
                            }
                          }
                          else {
                            normid._4_4_ = SGML_CATA_CATALOG;
                          }
                        }
                        else {
                          normid._4_4_ = SGML_CATA_DOCUMENT;
                        }
                      }
                      else {
                        normid._4_4_ = SGML_CATA_SGMLDECL;
                      }
                    }
                    else {
                      normid._4_4_ = SGML_CATA_NOTATION;
                    }
                  }
                  else {
                    normid._4_4_ = SGML_CATA_LINKTYPE;
                  }
                }
                else {
                  normid._4_4_ = SGML_CATA_DOCTYPE;
                }
              }
              else {
                normid._4_4_ = SGML_CATA_ENTITY;
              }
            }
            else {
              normid._4_4_ = SGML_CATA_DELEGATE;
            }
          }
          else {
            normid._4_4_ = SGML_CATA_PUBLIC;
          }
        }
        else {
          normid._4_4_ = SGML_CATA_SYSTEM;
        }
        (*xmlFree)(pxStack_58);
        pxStack_58 = (xmlChar *)0x0;
        if ((uint)(normid._4_4_ + ~XML_CATA_DELEGATE_URI) < 0xb ||
            normid._4_4_ == SGML_CATA_SGMLDECL) {
          iVar1 = (*(code *)(&DAT_00241044 +
                            *(int *)(&DAT_00241044 +
                                    (ulong)(uint)(normid._4_4_ + ~XML_CATA_DELEGATE_URI) * 4)))();
          return iVar1;
        }
        if (base == (xmlChar *)0x0) {
          pxStack_58 = (xmlChar *)0x0;
          if (name != (xmlChar *)0x0) {
            (*xmlFree)(name);
          }
          break;
        }
        if (normid._4_4_ == SGML_CATA_BASE) {
          if (pxStack_40 != (xmlChar *)0x0) {
            (*xmlFree)(pxStack_40);
          }
          pxStack_40 = xmlStrdup(name);
        }
        else if ((normid._4_4_ == SGML_CATA_PUBLIC) || (normid._4_4_ == SGML_CATA_SYSTEM)) {
          pxVar2 = xmlBuildURI(name,pxStack_40);
          if (pxVar2 != (xmlChar *)0x0) {
            pxVar3 = xmlNewCatalogEntry(normid._4_4_,pxStack_58,pxVar2,(xmlChar *)0x0,
                                        XML_CATA_PREFER_NONE,(xmlCatalogEntryPtr)0x0);
            sysid._4_4_ = xmlHashAddEntry(*(xmlHashTablePtr *)(value_local + 0x60),pxStack_58,pxVar3
                                         );
            if (sysid._4_4_ < 0) {
              xmlFreeCatalogEntry(pxVar3,(xmlChar *)0x0);
            }
            (*xmlFree)(pxVar2);
          }
        }
        else if (normid._4_4_ == SGML_CATA_CATALOG) {
          if (cur._4_4_ == 0) {
            pxVar2 = xmlBuildURI(name,pxStack_40);
            if (pxVar2 != (xmlChar *)0x0) {
              xmlExpandCatalog((xmlCatalogPtr)value_local,(char *)pxVar2);
              (*xmlFree)(pxVar2);
            }
          }
          else {
            pxVar3 = xmlNewCatalogEntry(SGML_CATA_CATALOG,name,(xmlChar *)0x0,(xmlChar *)0x0,
                                        XML_CATA_PREFER_NONE,(xmlCatalogEntryPtr)0x0);
            sysid._4_4_ = xmlHashAddEntry(*(xmlHashTablePtr *)(value_local + 0x60),name,pxVar3);
            if (sysid._4_4_ < 0) {
              xmlFreeCatalogEntry(pxVar3,(xmlChar *)0x0);
            }
          }
        }
        if (pxStack_58 != (xmlChar *)0x0) {
          (*xmlFree)(pxStack_58);
        }
        if (name != (xmlChar *)0x0) {
          (*xmlFree)(name);
        }
        goto LAB_0018ba11;
      }
      base = xmlParseSGMLCatalogComment(base);
    } while (base != (xmlChar *)0x0);
    if (pxStack_40 != (xmlChar *)0x0) {
      (*xmlFree)(pxStack_40);
    }
    if (base == (xmlChar *)0x0) {
      catal_local._4_4_ = -1;
    }
    else {
      catal_local._4_4_ = 0;
    }
  }
  return catal_local._4_4_;
}

Assistant:

static int
xmlParseSGMLCatalog(xmlCatalogPtr catal, const xmlChar *value,
	            const char *file, int super) {
    const xmlChar *cur = value;
    xmlChar *base = NULL;
    int res;

    if ((cur == NULL) || (file == NULL))
        return(-1);
    base = xmlStrdup((const xmlChar *) file);

    while ((cur != NULL) && (cur[0] != 0)) {
	SKIP_BLANKS;
	if (cur[0] == 0)
	    break;
	if ((cur[0] == '-') && (cur[1] == '-')) {
	    cur = xmlParseSGMLCatalogComment(cur);
	    if (cur == NULL) {
		/* error */
		break;
	    }
	} else {
	    xmlChar *sysid = NULL;
	    xmlChar *name = NULL;
	    xmlCatalogEntryType type = XML_CATA_NONE;

	    cur = xmlParseSGMLCatalogName(cur, &name);
	    if (cur == NULL || name == NULL) {
		/* error */
		break;
	    }
	    if (!IS_BLANK_CH(*cur)) {
		/* error */
		xmlFree(name);
		break;
	    }
	    SKIP_BLANKS;
	    if (xmlStrEqual(name, (const xmlChar *) "SYSTEM"))
                type = SGML_CATA_SYSTEM;
	    else if (xmlStrEqual(name, (const xmlChar *) "PUBLIC"))
                type = SGML_CATA_PUBLIC;
	    else if (xmlStrEqual(name, (const xmlChar *) "DELEGATE"))
                type = SGML_CATA_DELEGATE;
	    else if (xmlStrEqual(name, (const xmlChar *) "ENTITY"))
                type = SGML_CATA_ENTITY;
	    else if (xmlStrEqual(name, (const xmlChar *) "DOCTYPE"))
                type = SGML_CATA_DOCTYPE;
	    else if (xmlStrEqual(name, (const xmlChar *) "LINKTYPE"))
                type = SGML_CATA_LINKTYPE;
	    else if (xmlStrEqual(name, (const xmlChar *) "NOTATION"))
                type = SGML_CATA_NOTATION;
	    else if (xmlStrEqual(name, (const xmlChar *) "SGMLDECL"))
                type = SGML_CATA_SGMLDECL;
	    else if (xmlStrEqual(name, (const xmlChar *) "DOCUMENT"))
                type = SGML_CATA_DOCUMENT;
	    else if (xmlStrEqual(name, (const xmlChar *) "CATALOG"))
                type = SGML_CATA_CATALOG;
	    else if (xmlStrEqual(name, (const xmlChar *) "BASE"))
                type = SGML_CATA_BASE;
	    else if (xmlStrEqual(name, (const xmlChar *) "OVERRIDE")) {
		xmlFree(name);
		cur = xmlParseSGMLCatalogName(cur, &name);
		if (name == NULL) {
		    /* error */
		    break;
		}
		xmlFree(name);
		continue;
	    }
	    xmlFree(name);
	    name = NULL;

	    switch(type) {
		case SGML_CATA_ENTITY:
		    if (*cur == '%')
			type = SGML_CATA_PENTITY;
                    /* Falls through. */
		case SGML_CATA_PENTITY:
		case SGML_CATA_DOCTYPE:
		case SGML_CATA_LINKTYPE:
		case SGML_CATA_NOTATION:
		    cur = xmlParseSGMLCatalogName(cur, &name);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    if (!IS_BLANK_CH(*cur)) {
			/* error */
			break;
		    }
		    SKIP_BLANKS;
		    cur = xmlParseSGMLCatalogPubid(cur, &sysid);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    break;
		case SGML_CATA_PUBLIC:
		case SGML_CATA_SYSTEM:
		case SGML_CATA_DELEGATE:
		    cur = xmlParseSGMLCatalogPubid(cur, &name);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    if (type != SGML_CATA_SYSTEM) {
		        xmlChar *normid;

		        normid = xmlCatalogNormalizePublic(name);
		        if (normid != NULL) {
		            if (name != NULL)
		                xmlFree(name);
		            if (*normid != 0)
		                name = normid;
		            else {
		                xmlFree(normid);
		                name = NULL;
		            }
		        }
		    }
		    if (!IS_BLANK_CH(*cur)) {
			/* error */
			break;
		    }
		    SKIP_BLANKS;
		    cur = xmlParseSGMLCatalogPubid(cur, &sysid);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    break;
		case SGML_CATA_BASE:
		case SGML_CATA_CATALOG:
		case SGML_CATA_DOCUMENT:
		case SGML_CATA_SGMLDECL:
		    cur = xmlParseSGMLCatalogPubid(cur, &sysid);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    break;
		default:
		    break;
	    }
	    if (cur == NULL) {
		if (name != NULL)
		    xmlFree(name);
		if (sysid != NULL)
		    xmlFree(sysid);
		break;
	    } else if (type == SGML_CATA_BASE) {
		if (base != NULL)
		    xmlFree(base);
		base = xmlStrdup(sysid);
	    } else if ((type == SGML_CATA_PUBLIC) ||
		       (type == SGML_CATA_SYSTEM)) {
		xmlChar *filename;

		filename = xmlBuildURI(sysid, base);
		if (filename != NULL) {
		    xmlCatalogEntryPtr entry;

		    entry = xmlNewCatalogEntry(type, name, filename,
			                       NULL, XML_CATA_PREFER_NONE, NULL);
		    res = xmlHashAddEntry(catal->sgml, name, entry);
		    if (res < 0) {
			xmlFreeCatalogEntry(entry, NULL);
		    }
		    xmlFree(filename);
		}

	    } else if (type == SGML_CATA_CATALOG) {
		if (super) {
		    xmlCatalogEntryPtr entry;

		    entry = xmlNewCatalogEntry(type, sysid, NULL, NULL,
			                       XML_CATA_PREFER_NONE, NULL);
		    res = xmlHashAddEntry(catal->sgml, sysid, entry);
		    if (res < 0) {
			xmlFreeCatalogEntry(entry, NULL);
		    }
		} else {
		    xmlChar *filename;

		    filename = xmlBuildURI(sysid, base);
		    if (filename != NULL) {
			xmlExpandCatalog(catal, (const char *)filename);
			xmlFree(filename);
		    }
		}
	    }
	    /*
	     * drop anything else we won't handle it
	     */
	    if (name != NULL)
		xmlFree(name);
	    if (sysid != NULL)
		xmlFree(sysid);
	}
    }
    if (base != NULL)
	xmlFree(base);
    if (cur == NULL)
	return(-1);
    return(0);
}